

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.cpp
# Opt level: O1

void __thiscall CVmBifTable::CVmBifTable(CVmBifTable *this,size_t init_entries)

{
  vm_bif_entry_t **ppvVar1;
  char **ppcVar2;
  
  if (init_entries == 0) {
    this->table_ = (vm_bif_entry_t **)0x0;
    this->names_ = (char **)0x0;
  }
  else {
    ppvVar1 = (vm_bif_entry_t **)malloc(init_entries * 8);
    this->table_ = ppvVar1;
    ppcVar2 = (char **)malloc(init_entries * 8);
    this->names_ = ppcVar2;
  }
  this->count_ = 0;
  this->alloc_ = init_entries;
  return;
}

Assistant:

CVmBifTable::CVmBifTable(size_t init_entries)
{
    /* allocate space for our entries */
    if (init_entries != 0)
    {
        /* allocate the space */
        table_ = (vm_bif_entry_t **)
                 t3malloc(init_entries * sizeof(table_[0]));
        names_ = (char **)
                 t3malloc(init_entries * sizeof(names_[0]));
    }
    else
    {
        /* we have no entries */
        table_ = 0;
        names_ = 0;
    }

    /* no entries are defined yet */
    count_ = 0;

    /* remember the allocation size */
    alloc_ = init_entries;
}